

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eviction.cpp
# Opt level: O0

void ProtectNoBanConnections
               (vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>
                *eviction_candidates)

{
  iterator iVar1;
  iterator iVar2;
  vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_> *in_RDI;
  long in_FS_OFFSET;
  vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_> *in_stack_ffffffffffffffb0;
  __normal_iterator<const_NodeEvictionCandidate_*,_std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>_>
  *in_stack_ffffffffffffffb8;
  const_iterator in_stack_fffffffffffffff0;
  const_iterator __first;
  
  __first._M_current = *(NodeEvictionCandidate **)(in_FS_OFFSET + 0x28);
  iVar1 = std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>::begin
                    (in_stack_ffffffffffffffb0);
  iVar2 = std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>::end
                    (in_stack_ffffffffffffffb0);
  std::
  remove_if<__gnu_cxx::__normal_iterator<NodeEvictionCandidate*,std::vector<NodeEvictionCandidate,std::allocator<NodeEvictionCandidate>>>,ProtectNoBanConnections(std::vector<NodeEvictionCandidate,std::allocator<NodeEvictionCandidate>>&)::__0>
            (iVar1._M_current,iVar2._M_current);
  __gnu_cxx::
  __normal_iterator<NodeEvictionCandidate_const*,std::vector<NodeEvictionCandidate,std::allocator<NodeEvictionCandidate>>>
  ::__normal_iterator<NodeEvictionCandidate*>
            (in_stack_ffffffffffffffb8,
             (__normal_iterator<NodeEvictionCandidate_*,_std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>_>
              *)in_stack_ffffffffffffffb0);
  std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>::end
            (in_stack_ffffffffffffffb0);
  __gnu_cxx::
  __normal_iterator<NodeEvictionCandidate_const*,std::vector<NodeEvictionCandidate,std::allocator<NodeEvictionCandidate>>>
  ::__normal_iterator<NodeEvictionCandidate*>
            (in_stack_ffffffffffffffb8,
             (__normal_iterator<NodeEvictionCandidate_*,_std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>_>
              *)in_stack_ffffffffffffffb0);
  std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>::erase
            (in_RDI,__first,in_stack_fffffffffffffff0);
  if (*(NodeEvictionCandidate **)(in_FS_OFFSET + 0x28) == __first._M_current) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ProtectNoBanConnections(std::vector<NodeEvictionCandidate>& eviction_candidates)
{
    eviction_candidates.erase(std::remove_if(eviction_candidates.begin(), eviction_candidates.end(),
                                             [](NodeEvictionCandidate const& n) {
                                                 return n.m_noban;
                                             }),
                              eviction_candidates.end());
}